

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O3

void __thiscall chrono::ChSystem::Update(ChSystem *this,bool update_assets)

{
  element_type *peVar1;
  ChVisualSystem *pCVar2;
  rep_conflict rVar3;
  long lVar4;
  
  utils::ChProfileManager::Start_Profile("Update");
  if (this->is_initialized == false) {
    SetupInitial(this);
  }
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->timer_update).m_start.__d.__r = rVar3;
  ChAssembly::Update(&this->assembly,update_assets);
  peVar1 = (this->contact_container).
           super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x13])
            (this->ch_time,peVar1,(ulong)update_assets);
  pCVar2 = this->visual_system;
  if (update_assets && pCVar2 != (ChVisualSystem *)0x0) {
    (**(code **)(*(long *)pCVar2 + 0x58))(pCVar2,this);
  }
  lVar4 = std::chrono::_V2::system_clock::now();
  (this->timer_update).m_end.__d.__r = lVar4;
  (this->timer_update).m_total.__r =
       (double)(lVar4 - (this->timer_update).m_start.__d.__r) / 1000000000.0 +
       (this->timer_update).m_total.__r;
  utils::ChProfileManager::Stop_Profile();
  return;
}

Assistant:

void ChSystem::Update(bool update_assets) {
    CH_PROFILE("Update");

    if (!is_initialized)
        SetupInitial();

    timer_update.start();  // Timer for profiling

    // Update underlying assembly (recursively update sub objects bodies, links, etc)
    assembly.Update(update_assets);

    // Update all contacts, if any
    contact_container->Update(ch_time, update_assets);

    // Update any attached visualization system only when also updating assets
    if (visual_system && update_assets)
        visual_system->OnUpdate(this);

    timer_update.stop();
}